

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  libssh2_nonblocking_states *plVar1;
  uchar *puVar2;
  int iVar3;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar4;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar5;
  size_t sVar6;
  char *pcVar7;
  uchar *buf_00;
  uchar *buf_01;
  uchar *data;
  size_t data_len;
  string_buf buf;
  uchar *extname;
  uchar *local_80;
  uchar *local_78;
  uchar *local_70;
  size_t local_68;
  time_t local_60;
  string_buf local_58;
  uchar *local_40;
  uchar *local_38;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 4) != 0) {
      start_time = time((time_t *)0x0);
      plVar1 = &session->sftpInit_state;
      buf_01 = session->sftpInit_buffer;
      buf_00 = session->sftpInit_buffer + 5;
      do {
        local_68 = 0;
        if (*plVar1 == libssh2_NB_state_idle) {
          if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
            __assert_fail("!session->sftpInit_sftp",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                          ,0x335,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
          }
          session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
          session->sftpInit_state = libssh2_NB_state_created;
        }
        sftp = session->sftpInit_sftp;
        if (session->sftpInit_state == libssh2_NB_state_created) {
          pLVar4 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
          session->sftpInit_channel = pLVar4;
          if (pLVar4 != (LIBSSH2_CHANNEL *)0x0) {
            *plVar1 = libssh2_NB_state_sent;
            goto LAB_00122e9d;
          }
          iVar3 = libssh2_session_last_errno(session);
          if (iVar3 == -0x25) {
            pcVar7 = "Would block starting up channel";
            goto LAB_001230de;
          }
          _libssh2_error(session,-0x15,"Unable to startup channel");
          session->sftpInit_state = libssh2_NB_state_idle;
        }
        else {
LAB_00122e9d:
          if (*plVar1 == libssh2_NB_state_sent) {
            iVar3 = _libssh2_channel_process_startup
                              (session->sftpInit_channel,"subsystem",9,"sftp",4);
            if (iVar3 == 0) {
              *plVar1 = libssh2_NB_state_sent1;
              iVar3 = 0;
            }
            else if (iVar3 == -0x25) {
              _libssh2_error(session,-0x25,"Would block to request SFTP subsystem");
              iVar3 = 1;
            }
            else {
              _libssh2_error(session,-0x15,"Unable to request SFTP subsystem");
              iVar3 = 4;
            }
            if (iVar3 != 4) {
              if (iVar3 != 0) goto LAB_001231e0;
              goto LAB_00122f49;
            }
          }
          else {
LAB_00122f49:
            if (*plVar1 == libssh2_NB_state_sent1) {
              iVar3 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
              if (iVar3 == -0x25) {
                pcVar7 = "Would block requesting handle extended data";
                goto LAB_001230de;
              }
              sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x168);
              session->sftpInit_sftp = sftp;
              if (sftp != (LIBSSH2_SFTP *)0x0) {
                sftp->channel = session->sftpInit_channel;
                sftp->request_id = 0;
                _libssh2_htonu32(buf_01,5);
                session->sftpInit_buffer[4] = '\x01';
                _libssh2_htonu32(buf_00,3);
                session->sftpInit_sent = 0;
                session->sftpInit_state = libssh2_NB_state_sent2;
                goto LAB_00122fe6;
              }
              iVar3 = -6;
              pcVar7 = "Unable to allocate a new SFTP structure";
            }
            else {
LAB_00122fe6:
              if (*plVar1 == libssh2_NB_state_sent2) {
                sVar5 = _libssh2_channel_write
                                  (session->sftpInit_channel,0,buf_01 + session->sftpInit_sent,
                                   9 - session->sftpInit_sent);
                if (sVar5 == -0x25) {
                  pcVar7 = "Would block sending SSH_FXP_INIT";
                  goto LAB_001230de;
                }
                if (sVar5 < 0) {
                  iVar3 = -7;
                  pcVar7 = "Unable to send SSH_FXP_INIT";
                  goto LAB_001231d3;
                }
                sVar6 = sVar5 + session->sftpInit_sent;
                session->sftpInit_sent = sVar6;
                if (sVar6 == 9) {
                  *plVar1 = libssh2_NB_state_sent3;
                }
              }
              if (*plVar1 == libssh2_NB_state_error_closing) {
                iVar3 = _libssh2_channel_free(session->sftpInit_channel);
                if (iVar3 != -0x25) {
                  session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
                  if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
                    (*session->free)(session->sftpInit_sftp,&session->abstract);
                    session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
                  }
                  *plVar1 = libssh2_NB_state_idle;
                  goto LAB_001231e0;
                }
                pcVar7 = "Would block closing channel";
LAB_001230de:
                _libssh2_error(session,-0x25,pcVar7);
                goto LAB_001231e0;
              }
              iVar3 = sftp_packet_require(sftp,'\x02',0,&local_80,&local_68,5);
              sVar6 = local_68;
              puVar2 = local_80;
              if (iVar3 == -0x26) {
                if (local_68 != 0) {
                  (*session->free)(local_80,&session->abstract);
                }
                iVar3 = -0x1f;
                pcVar7 = "Invalid SSH_FXP_VERSION response";
              }
              else if (iVar3 == 0) {
                local_58.data = local_80;
                local_58.dataptr = local_80 + 1;
                local_58.len = local_68;
                out = &sftp->version;
                local_78 = buf_00;
                local_70 = buf_01;
                local_60 = start_time;
                iVar3 = _libssh2_get_u32(&local_58,out);
                start_time = local_60;
                if (iVar3 != 0) {
                  (*session->free)(local_80,&session->abstract);
                  buf_00 = local_78;
                  start_time = local_60;
                  buf_01 = local_70;
                  goto LAB_001231d8;
                }
                if (3 < *out) {
                  *out = 3;
                }
                do {
                  if (puVar2 + sVar6 <= local_58.dataptr) {
                    (*session->free)(local_80,&session->abstract);
                    pLVar4 = sftp->channel;
                    pLVar4->abstract = sftp;
                    pLVar4->close_cb = libssh2_sftp_dtor;
                    *(undefined8 *)plVar1 = 0;
                    *(undefined8 *)((long)&session->sftpInit_sftp + 4) = 0;
                    *(undefined4 *)((long)&session->sftpInit_channel + 4) = 0;
                    _libssh2_list_init(&sftp->sftp_handles);
                    buf_00 = local_78;
                    buf_01 = local_70;
                    goto LAB_001231e2;
                  }
                  iVar3 = _libssh2_get_string(&local_58,&local_38,(size_t *)0x0);
                  if (iVar3 != 0) {
                    (*session->free)(local_80,&session->abstract);
                    pcVar7 = "Data too short when extracting extname";
                    goto LAB_001232dd;
                  }
                  iVar3 = _libssh2_get_string(&local_58,&local_40,(size_t *)0x0);
                } while (iVar3 == 0);
                (*session->free)(local_80,&session->abstract);
                pcVar7 = "Data too short when extracting extdata";
LAB_001232dd:
                iVar3 = -0x26;
                buf_00 = local_78;
                buf_01 = local_70;
              }
              else {
                if (iVar3 == -0x25) {
                  pcVar7 = "Would block receiving SSH_FXP_VERSION";
                  goto LAB_001230de;
                }
                pcVar7 = "Timeout waiting for response from SFTP subsystem";
              }
            }
LAB_001231d3:
            _libssh2_error(session,iVar3,pcVar7);
          }
LAB_001231d8:
          *plVar1 = libssh2_NB_state_error_closing;
        }
LAB_001231e0:
        sftp = (LIBSSH2_SFTP *)0x0;
LAB_001231e2:
        if (session->api_block_mode == 0) {
          return sftp;
        }
        if (sftp != (LIBSSH2_SFTP *)0x0) {
          return sftp;
        }
        iVar3 = libssh2_session_last_errno(session);
        if (iVar3 != -0x25) {
          return (LIBSSH2_SFTP *)0x0;
        }
        iVar3 = _libssh2_wait_socket(session,start_time);
        if (iVar3 != 0) {
          return (LIBSSH2_SFTP *)0x0;
        }
      } while( true );
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}